

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

void helics::CoreFactory::terminateAllCores(void)

{
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *__range2;
  shared_ptr<helics::Core> *core;
  pointer psVar1;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> cores;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> local_28;
  
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::getObjects
            (&local_28,(SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores);
  for (psVar1 = local_28.
                super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 != local_28.
                super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar1 = psVar1 + 1) {
    (*((psVar1->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Core[8]
    )();
  }
  gmlc::concurrency::DelayedDestructor<helics::Core>::destroyObjects
            ((DelayedDestructor<helics::Core> *)delayedDestroyer,(milliseconds)0xfa);
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
  ~vector(&local_28);
  return;
}

Assistant:

void terminateAllCores()
{
    auto cores = searchableCores.getObjects();
    for (auto& core : cores) {
        core->disconnect();
    }
    cleanUpCores(std::chrono::milliseconds(250));
}